

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void asm_snap_alloc(ASMState *as,int snapno)

{
  byte bVar1;
  uint uVar2;
  SnapShot *pSVar3;
  SnapEntry *pSVar4;
  uint ref;
  ulong uVar5;
  
  pSVar3 = as->T->snap;
  uVar2 = pSVar3[snapno].mapofs;
  pSVar4 = as->T->snapmap;
  bVar1 = pSVar3[snapno].nent;
  as->snapfilt1 = 0;
  as->snapfilt2 = 0;
  for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
    ref = (uint)(ushort)pSVar4[uVar2 + uVar5];
    if (0x7fff < ref) {
      asm_snap_alloc1(as,ref);
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as, int snapno)
{
  SnapShot *snap = &as->T->snap[snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  as->snapfilt1 = as->snapfilt2 = 0;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lj_assertA(irt_type(IR(ref+1)->t) == IRT_SOFTFP,
		   "snap %d[%d] points to bad SOFTFP IR %04d",
		   snapno, n, ref - REF_BIAS);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}